

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O2

bool __thiscall
andres::View<unsigned_char,false,std::allocator<unsigned_long>>::
overlaps<unsigned_char,false,std::allocator<unsigned_long>>
          (View<unsigned_char,false,std::allocator<unsigned_long>> *this,
          View<unsigned_char,_false,_std::allocator<unsigned_long>_> *v)

{
  reference puVar1;
  reference puVar2;
  bool bVar3;
  reference puVar4;
  reference puVar5;
  void *vDataPointer_;
  void *dataPointer_;
  
  View<unsigned_char,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<unsigned_char,_false,_std::allocator<unsigned_long>_> *)this);
  View<unsigned_char,_false,_std::allocator<unsigned_long>_>::testInvariant(v);
  puVar1 = *(reference *)this;
  if ((puVar1 == (reference)0x0) || (puVar2 = v->data_, puVar2 == (reference)0x0)) {
    bVar3 = false;
  }
  else {
    puVar4 = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::operator()
                       ((View<unsigned_char,_false,_std::allocator<unsigned_long>_> *)this,
                        *(long *)(this + 0x30) - 1);
    puVar5 = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::operator()
                       (v,(v->geometry_).size_ - 1);
    if ((puVar2 < puVar1) || (puVar4 < puVar2)) {
      if (puVar1 < puVar2) {
        return false;
      }
      if (puVar5 < puVar1) {
        return false;
      }
    }
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

inline bool View<T, isConst, A>::overlaps
(
    const View<TLocal, isConstLocal, ALocal>& v
) const
{
    testInvariant();
    if(!MARRAY_NO_ARG_TEST) {
        v.testInvariant();
    }
    if(data_ == 0 || v.data_ == 0) {
        return false;
    }
    else {
        const void* dataPointer_ = data_;
        const void* vDataPointer_ = v.data_;
        const void* maxPointer = & (*this)(this->size()-1);
        const void* maxPointerV = & v(v.size()-1);
        if(    (dataPointer_   <= vDataPointer_ && vDataPointer_ <= maxPointer)
            || (vDataPointer_ <= dataPointer_   && dataPointer_   <= maxPointerV) )
        {
            return true;
        }
    }
    return false;
}